

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iGenfuner.cpp
# Opt level: O1

bool __thiscall Imaginer::Utils::iGenFuner::generater(iGenFuner *this)

{
  double __y;
  uint uVar1;
  RPNnode *pRVar2;
  _funer *p_Var3;
  int iVar4;
  undefined1 uVar5;
  bool bVar6;
  long lVar7;
  anon_union_8_2_93b31755_for__node *paVar8;
  ostream *poVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  double dVar13;
  iStack<Imaginer::Utils::iRpn::RPNnode> result;
  RPNnode curnode;
  iRpn rpn;
  iStack<Imaginer::Utils::iRpn::RPNnode> local_98;
  iGenFuner *local_88;
  byte local_79;
  ulong local_78;
  anon_union_8_2_93b31755_for__node local_70;
  char local_68;
  anon_union_8_2_93b31755_for__node local_60;
  ulong local_58;
  iRpn local_50;
  
  local_88 = this;
  iRpn::iRpn(&local_50,this->_expname);
  bVar6 = iRpn::genRpn(&local_50);
  if (bVar6) {
    local_98._size = 0x400;
    local_98._top = -1;
    local_98._data = (RPNnode *)operator_new__(0x4000);
    lVar10 = 0;
    do {
      (&(local_98._data)->_is)[lVar10] = false;
      *(undefined8 *)((long)&(local_98._data)->_node + lVar10) = 0;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x4000);
    uVar1 = (local_50._operands)->_top;
    uVar12 = uVar1 >> 0x1f;
    bVar6 = SUB41(uVar1 >> 0x1f,0);
    local_68 = '\0';
    local_70._value = 0.0;
    if (-1 < (long)(int)uVar1) {
      local_58 = (ulong)(uVar1 + 1);
      lVar10 = 8;
      uVar11 = 0;
      local_78 = 0;
      do {
        bVar6 = SUB41(uVar12,0);
        pRVar2 = (local_50._operands)->_data;
        if ((anon_union_8_2_93b31755_for__node *)((long)pRVar2 + lVar10 + -8) != &local_70) {
          local_70 = *(anon_union_8_2_93b31755_for__node *)((long)pRVar2 + lVar10 + -8);
          local_68 = *(char *)((long)&pRVar2->_node + lVar10);
        }
        if (local_68 != '\0') {
          lVar7 = (long)local_98._top;
          local_98._top = (int)(lVar7 + 1);
          paVar8 = &local_98._data[lVar7 + 1]._node;
          if (paVar8 != &local_70) {
            *paVar8 = local_70;
            paVar8[1]._sign = local_68;
          }
          poVar9 = operator<<((ostream *)&std::cout,(RPNnode *)&local_70);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          goto switchD_00104119_caseD_2c;
        }
        uVar5 = local_70._sign;
        if ((local_70._sign + 0xa8U & 0xde) == 0) {
          local_60 = (anon_union_8_2_93b31755_for__node)
                     ((ulong)local_60 & 0xffffffffffffff00 | (ulong)local_70 & 0xff);
          lVar7 = (long)local_98._top + 1;
          local_98._top = (int)lVar7;
          local_98._data[lVar7]._node = local_60;
          local_98._data[lVar7]._is = false;
          local_78 = 1;
          goto switchD_00104119_caseD_2c;
        }
        if (local_98._top < 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"expression invaild: ",0x14);
          local_79 = uVar5;
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_79,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," need two operands",0x12);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          goto LAB_001042aa;
        }
        lVar7 = (long)local_98._top;
        bVar6 = local_98._top == 0;
        local_98._top = local_98._top + -1;
        dVar13 = local_98._data[lVar7]._node._value;
        if (bVar6) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"stack is empty",0xe);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
          std::ostream::put('\x10');
          std::ostream::flush();
        }
        iVar4 = local_98._top;
        lVar7 = (long)local_98._top;
        local_98._top = local_98._top + -1;
        __y = local_98._data[lVar7]._node._value;
        if (5 < (byte)uVar5 - 0x2a) {
          if (uVar5 == 0x5e) {
            if ((local_78 & 1) != 0) goto LAB_001041fe;
            dVar13 = pow(dVar13,__y);
            lVar7 = (long)local_98._top + 1;
            local_98._top = (int)lVar7;
            local_98._data[lVar7]._node =
                 (anon_union_8_2_93b31755_for__node)(dVar13 & 0xffffffffffffff00);
            local_98._data[lVar7]._is = true;
          }
          goto switchD_00104119_caseD_2c;
        }
        switch((uint)(byte)uVar5) {
        case 0x2a:
          if ((local_78 & 1) == 0) {
            dVar13 = dVar13 * __y;
            break;
          }
LAB_001041fe:
          p_Var3 = (local_88->_opstream)._data;
          lVar7 = (long)(local_88->_opstream)._top + 1;
          (local_88->_opstream)._top = (int)lVar7;
          p_Var3[lVar7]._fun = _funer::_add;
          p_Var3[lVar7]._value = dVar13;
          goto switchD_00104119_caseD_2c;
        case 0x2b:
          if ((local_78 & 1) != 0) goto LAB_001041fe;
          dVar13 = dVar13 + __y;
          break;
        default:
          goto switchD_00104119_caseD_2c;
        case 0x2d:
          if ((local_78 & 1) != 0) goto LAB_001041fe;
          dVar13 = dVar13 - __y;
          break;
        case 0x2f:
          if ((local_78 & 1) != 0) goto LAB_001041fe;
          dVar13 = dVar13 / __y;
        }
        local_98._8_8_ = CONCAT44(iVar4,local_98._size);
        local_98._data[lVar7]._node =
             (anon_union_8_2_93b31755_for__node)(dVar13 & 0xffffffffffffff00);
        local_98._data[lVar7]._is = true;
switchD_00104119_caseD_2c:
        bVar6 = (ulong)(long)(int)uVar1 <= uVar11;
        uVar11 = uVar11 + 1;
        uVar12 = (uint)bVar6;
        lVar10 = lVar10 + 0x10;
      } while (local_58 != uVar11);
    }
    poVar9 = operator<<((ostream *)&std::cout,&local_98);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
LAB_001042aa:
    if (local_98._data != (RPNnode *)0x0) {
      operator_delete__(local_98._data);
      local_98._data = (RPNnode *)0x0;
    }
  }
  else {
    bVar6 = false;
  }
  iRpn::~iRpn(&local_50);
  return bVar6;
}

Assistant:

bool   iGenFuner::generater()
{
    iRpn rpn(_expname);
    if(! rpn.genRpn())
        return false;
    iStack<iRpn::RPNnode> result;
    iStack<iRpn::RPNnode>* _operands = rpn.getOperands();
    int size = _operands->size();
    iRpn::RPNnode curnode;    
    char op = '\0';
    bool haveXY = false;
    iRpn::RPNnode  loperand;
    iRpn::RPNnode  roperand;
    bool top_bottom = false;//flag to record a unkowns value is top(true) or bottom(false)
    for(int i = 0;i <= size; ++i)
    {
        curnode = (*_operands)[i];
        if(!curnode)//opearator
        {
            op = curnode;
            if(rpn.isVariable(op))//未知数
            {
                haveXY = true;
                result.push(op);
                if(!result.empty())
                {
                    top_bottom = true;
                }
            }else
            {
                if(result.size() < 1)
                {
                    std::cout << "expression invaild: " << op  <<
                                 " need two operands" << std::endl;
                    return false;
                }
                loperand = result.pop();
                roperand = result.pop();
                switch (op) {
                case '+':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand+roperand);
                    break;
                case '-':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand-roperand);
                    break;
                case '*':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));

                        break;
                    }
                    result.push(loperand*roperand);
                    break;
                case '/':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand/roperand);
                    break;
                case '^':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand^roperand);
                    break;
                default:
                    break;
                }
            }
        }
        else//operand
        {
            result.push(curnode);
            std::cout << curnode << "\n";
        }
    }
    std::cout << result << std::endl;
    //result.destroy();
    return true;
}